

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O3

void generate_table_filename(char *sort,uint time_iter,uint global_iteration,char *filename)

{
  char dirname [64];
  char local_68 [64];
  
  mkdir("results",0x1c0);
  mkdir("results/dat",0x1c0);
  local_68[0x30] = '\0';
  local_68[0x31] = '\0';
  local_68[0x32] = '\0';
  local_68[0x33] = '\0';
  local_68[0x34] = '\0';
  local_68[0x35] = '\0';
  local_68[0x36] = '\0';
  local_68[0x37] = '\0';
  local_68[0x38] = '\0';
  local_68[0x39] = '\0';
  local_68[0x3a] = '\0';
  local_68[0x3b] = '\0';
  local_68[0x3c] = '\0';
  local_68[0x3d] = '\0';
  local_68[0x3e] = '\0';
  local_68[0x3f] = '\0';
  local_68[0x20] = '\0';
  local_68[0x21] = '\0';
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x2e] = '\0';
  local_68[0x2f] = '\0';
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  snprintf(local_68,0x40,"results/dat/%u",(ulong)global_iteration);
  mkdir(local_68,0x1c0);
  snprintf(filename,0x40,"results/dat/%u/%s_at_%u_iteration.dat",(ulong)global_iteration,sort,
           time_iter);
  return;
}

Assistant:

void generate_table_filename (char const * sort,
                              unsigned time_iter,
                              unsigned global_iteration,
                              char * filename) {

  mkdir ("results", S_IRWXU);
  mkdir ("results/dat", S_IRWXU);

  char dirname[MAX_FILENAME_SIZE] = "";
  snprintf(dirname, MAX_FILENAME_SIZE, "results/dat/%u", global_iteration);
  mkdir (dirname, S_IRWXU);

  snprintf (filename, 
            MAX_FILENAME_SIZE, 
            "results/dat/%u/%s_at_%u_iteration.dat", 
            global_iteration, 
            sort, 
            time_iter);
  return;
}